

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

void Abc_NtkPermute(Abc_Ntk_t *pNtk,int fInputs,int fOutputs,int fFlops,char *pFlopPermFile)

{
  Vec_Int_t **p;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar7;
  void *pvVar8;
  void *pvVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  Vec_Int_t *local_48;
  
  uVar11 = pNtk->nObjCounts[8];
  uVar12 = (ulong)uVar11;
  if (pFlopPermFile == (char *)0x0) {
    local_48 = Vec_IntStartNatural(uVar11);
    bVar13 = fInputs == 0;
    bVar14 = fOutputs == 0;
    bVar15 = fFlops == 0;
  }
  else {
    local_48 = Abc_NtkReadFlopPerm(pFlopPermFile,uVar11);
    if (local_48 == (Vec_Int_t *)0x0) {
      return;
    }
    bVar15 = true;
    bVar14 = true;
    bVar13 = true;
  }
  pVVar5 = Vec_IntStartNatural(pNtk->vPis->nSize);
  pVVar6 = Vec_IntStartNatural(pNtk->vPos->nSize);
  if (!bVar13) {
    for (iVar3 = 0; iVar3 < pNtk->vPis->nSize; iVar3 = iVar3 + 1) {
      iVar10 = rand();
      uVar12 = (long)iVar10 % (long)pNtk->vPis->nSize;
      iVar10 = Vec_IntEntry(pVVar5,iVar3);
      iVar4 = (int)uVar12;
      iVar2 = Vec_IntEntry(pVVar5,iVar4);
      Vec_IntWriteEntry(pVVar5,iVar3,iVar2);
      Vec_IntWriteEntry(pVVar5,iVar4,iVar10);
      pvVar8 = Vec_PtrEntry(pNtk->vPis,iVar3);
      pVVar1 = pNtk->vPis;
      pvVar9 = Vec_PtrEntry(pVVar1,iVar4);
      Vec_PtrWriteEntry(pVVar1,iVar3,pvVar9);
      Vec_PtrWriteEntry(pNtk->vPis,iVar4,pvVar8);
      pvVar8 = Vec_PtrEntry(pNtk->vCis,iVar3);
      pVVar1 = pNtk->vCis;
      pvVar9 = Vec_PtrEntry(pVVar1,iVar4);
      Vec_PtrWriteEntry(pVVar1,iVar3,pvVar9);
      uVar12 = uVar12 & 0xffffffff;
      Vec_PtrWriteEntry(pNtk->vCis,iVar4,pvVar8);
    }
  }
  if (!bVar14) {
    for (iVar3 = 0; iVar3 < pNtk->vPos->nSize; iVar3 = iVar3 + 1) {
      iVar10 = rand();
      uVar12 = (long)iVar10 % (long)pNtk->vPos->nSize;
      iVar10 = Vec_IntEntry(pVVar6,iVar3);
      iVar4 = (int)uVar12;
      iVar2 = Vec_IntEntry(pVVar6,iVar4);
      Vec_IntWriteEntry(pVVar6,iVar3,iVar2);
      Vec_IntWriteEntry(pVVar6,iVar4,iVar10);
      pvVar8 = Vec_PtrEntry(pNtk->vPos,iVar3);
      pVVar1 = pNtk->vPos;
      pvVar9 = Vec_PtrEntry(pVVar1,iVar4);
      Vec_PtrWriteEntry(pVVar1,iVar3,pvVar9);
      Vec_PtrWriteEntry(pNtk->vPos,iVar4,pvVar8);
      pvVar8 = Vec_PtrEntry(pNtk->vCos,iVar3);
      pVVar1 = pNtk->vCos;
      pvVar9 = Vec_PtrEntry(pVVar1,iVar4);
      Vec_PtrWriteEntry(pVVar1,iVar3,pvVar9);
      uVar12 = uVar12 & 0xffffffff;
      Vec_PtrWriteEntry(pNtk->vCos,iVar4,pvVar8);
    }
  }
  iVar10 = (int)uVar12;
  iVar3 = pNtk->vBoxes->nSize;
  if (iVar3 == pNtk->nObjCounts[8]) {
    if (!bVar15) {
      for (iVar2 = 0; iVar10 = (int)uVar12, iVar2 < iVar3; iVar2 = iVar2 + 1) {
        iVar10 = rand();
        iVar10 = iVar10 % pNtk->nObjCounts[8];
        iVar3 = Vec_IntEntry(local_48,iVar2);
        iVar4 = Vec_IntEntry(local_48,iVar10);
        Vec_IntWriteEntry(local_48,iVar2,iVar4);
        Vec_IntWriteEntry(local_48,iVar10,iVar3);
        pvVar8 = Vec_PtrEntry(pNtk->vBoxes,iVar2);
        pVVar1 = pNtk->vBoxes;
        pvVar9 = Vec_PtrEntry(pVVar1,iVar10);
        Vec_PtrWriteEntry(pVVar1,iVar2,pvVar9);
        Vec_PtrWriteEntry(pNtk->vBoxes,iVar10,pvVar8);
        pvVar8 = Vec_PtrEntry(pNtk->vCis,pNtk->vPis->nSize + iVar2);
        pVVar1 = pNtk->vCis;
        iVar3 = pNtk->vPis->nSize;
        pvVar9 = Vec_PtrEntry(pVVar1,iVar3 + iVar10);
        Vec_PtrWriteEntry(pVVar1,iVar3 + iVar2,pvVar9);
        Vec_PtrWriteEntry(pNtk->vCis,pNtk->vPis->nSize + iVar10,pvVar8);
        pvVar8 = Vec_PtrEntry(pNtk->vCos,pNtk->vPos->nSize + iVar2);
        pVVar1 = pNtk->vCos;
        iVar3 = pNtk->vPos->nSize;
        pvVar9 = Vec_PtrEntry(pVVar1,iVar3 + iVar10);
        Vec_PtrWriteEntry(pVVar1,iVar3 + iVar2,pvVar9);
        uVar11 = iVar10 + pNtk->vPos->nSize;
        uVar12 = (ulong)uVar11;
        Vec_PtrWriteEntry(pNtk->vCos,uVar11,pvVar8);
        iVar3 = pNtk->nObjCounts[8];
      }
    }
    p_00 = Vec_IntInvert(pVVar5,iVar10);
    Vec_IntFree(pVVar5);
    pVVar5 = Vec_IntInvert(pVVar6,iVar10);
    Vec_IntFree(pVVar6);
    pVVar6 = Vec_IntInvert(local_48,iVar10);
    Vec_IntFree(local_48);
    p = &pNtk->vObjPerm;
    Vec_IntFreeP(p);
    pVVar7 = Vec_IntAlloc(pNtk->vPos->nSize + pNtk->vPis->nSize + pNtk->nObjCounts[8]);
    pNtk->vObjPerm = pVVar7;
    iVar3 = p_00->nSize;
    iVar10 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
      iVar10 = 0;
    }
    for (; iVar3 != iVar10; iVar10 = iVar10 + 1) {
      iVar2 = Vec_IntEntry(p_00,iVar10);
      Vec_IntPush(*p,iVar2);
    }
    iVar3 = pVVar5->nSize;
    iVar10 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != iVar10; iVar10 = iVar10 + 1) {
      iVar2 = Vec_IntEntry(pVVar5,iVar10);
      Vec_IntPush(*p,iVar2);
    }
    iVar3 = pVVar6->nSize;
    iVar10 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != iVar10; iVar10 = iVar10 + 1) {
      iVar2 = Vec_IntEntry(pVVar6,iVar10);
      Vec_IntPush(*p,iVar2);
    }
    Vec_IntFree(p_00);
    Vec_IntFree(pVVar5);
    Vec_IntFree(pVVar6);
    return;
  }
  __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                ,0x7e3,"void Abc_NtkPermute(Abc_Ntk_t *, int, int, int, char *)");
}

Assistant:

void Abc_NtkPermute( Abc_Ntk_t * pNtk, int fInputs, int fOutputs, int fFlops, char * pFlopPermFile )
{
    Abc_Obj_t * pTemp;
    Vec_Int_t * vInputs, * vOutputs, * vFlops, * vTemp;
    int i, k, Entry;
    // start permutation arrays
    if ( pFlopPermFile )
    {
        vFlops = Abc_NtkReadFlopPerm( pFlopPermFile, Abc_NtkLatchNum(pNtk) );
        if ( vFlops == NULL )
            return;
        fInputs  = 0;
        fOutputs = 0;
        fFlops   = 0;
    }
    else
        vFlops   = Vec_IntStartNatural( Abc_NtkLatchNum(pNtk) );
    vInputs  = Vec_IntStartNatural( Abc_NtkPiNum(pNtk) );
    vOutputs = Vec_IntStartNatural( Abc_NtkPoNum(pNtk) );
    // permute inputs
    if ( fInputs )
    for ( i = 0; i < Abc_NtkPiNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkPiNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vInputs, i );
        Vec_IntWriteEntry( vInputs, i, Vec_IntEntry(vInputs, k) );
        Vec_IntWriteEntry( vInputs, k, Entry );
        // swap PIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vPis, i );
        Vec_PtrWriteEntry( pNtk->vPis, i, Vec_PtrEntry(pNtk->vPis, k) );
        Vec_PtrWriteEntry( pNtk->vPis, k, pTemp );
        // swap CIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCis, i );
        Vec_PtrWriteEntry( pNtk->vCis, i, Vec_PtrEntry(pNtk->vCis, k) );
        Vec_PtrWriteEntry( pNtk->vCis, k, pTemp );
//printf( "Swapping PIs %d and %d.\n", i, k );
    }
    // permute outputs
    if ( fOutputs )
    for ( i = 0; i < Abc_NtkPoNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkPoNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vOutputs, i );
        Vec_IntWriteEntry( vOutputs, i, Vec_IntEntry(vOutputs, k) );
        Vec_IntWriteEntry( vOutputs, k, Entry );
        // swap POs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vPos, i );
        Vec_PtrWriteEntry( pNtk->vPos, i, Vec_PtrEntry(pNtk->vPos, k) );
        Vec_PtrWriteEntry( pNtk->vPos, k, pTemp );
        // swap COs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCos, i );
        Vec_PtrWriteEntry( pNtk->vCos, i, Vec_PtrEntry(pNtk->vCos, k) );
        Vec_PtrWriteEntry( pNtk->vCos, k, pTemp );
//printf( "Swapping POs %d and %d.\n", i, k );
    }
    // permute flops
    assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
    if ( fFlops )
    for ( i = 0; i < Abc_NtkLatchNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkLatchNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vFlops, i );
        Vec_IntWriteEntry( vFlops, i, Vec_IntEntry(vFlops, k) );
        Vec_IntWriteEntry( vFlops, k, Entry );
        // swap flops
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vBoxes, i );
        Vec_PtrWriteEntry( pNtk->vBoxes, i, Vec_PtrEntry(pNtk->vBoxes, k) );
        Vec_PtrWriteEntry( pNtk->vBoxes, k, pTemp );
        // swap CIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+i );
        Vec_PtrWriteEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+i, Vec_PtrEntry(pNtk->vCis, Abc_NtkPiNum(pNtk)+k) );
        Vec_PtrWriteEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+k, pTemp );
        // swap COs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+i );
        Vec_PtrWriteEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+i, Vec_PtrEntry(pNtk->vCos, Abc_NtkPoNum(pNtk)+k) );
        Vec_PtrWriteEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+k, pTemp );

//printf( "Swapping flops %d and %d.\n", i, k );
    }
    // invert arrays
    vInputs = Vec_IntInvert( vTemp = vInputs, -1 );
    Vec_IntFree( vTemp );
    vOutputs = Vec_IntInvert( vTemp = vOutputs, -1 );
    Vec_IntFree( vTemp );
    vFlops = Vec_IntInvert( vTemp = vFlops, -1 );
    Vec_IntFree( vTemp );
    // pack the results into the output array
    Vec_IntFreeP( &pNtk->vObjPerm );
    pNtk->vObjPerm = Vec_IntAlloc( Abc_NtkPiNum(pNtk) + Abc_NtkPoNum(pNtk) + Abc_NtkLatchNum(pNtk) );
    Vec_IntForEachEntry( vInputs, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    Vec_IntForEachEntry( vOutputs, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    Vec_IntForEachEntry( vFlops, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    // cleanup
    Vec_IntFree( vInputs );
    Vec_IntFree( vOutputs );
    Vec_IntFree( vFlops );
}